

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>_>
::_InternalParse(Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>_>
                 *this,char *ptr,ParseContext *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  size_type sVar1;
  Block *other;
  bool bVar2;
  value_type *pvVar3;
  KeyMapEntryAccessorType *this_00;
  ValueMapEntryAccessorType *this_01;
  char *local_28;
  
  local_28 = ptr;
  bVar2 = ParseContext::Done(ctx,&local_28);
  if (bVar2) {
    if (local_28 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else if (*local_28 == '\n') {
    value = &this->key_;
    local_28 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::Read(local_28 + 1,ctx,value);
    if (local_28 == (char *)0x0) {
      return (char *)0x0;
    }
    bVar2 = CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse::ValidateKey
                      (value);
    if (!bVar2) {
      return (char *)0x0;
    }
    bVar2 = ParseContext::Done(ctx,&local_28);
    if (bVar2) {
      if (local_28 == (char *)0x0) {
        return (char *)0x0;
      }
LAB_001be64e:
      NewEntry(this);
    }
    else {
      if (*local_28 != '\x12') goto LAB_001be64e;
      sVar1 = *(size_type *)this->map_;
      pvVar3 = Map<std::__cxx11::string,CoreML::Specification::MILSpec::Block>::InnerMap::
               operator[]<std::__cxx11::string&>((InnerMap *)this->map_,value);
      this->value_ptr_ = (Block *)(pvVar3 + 0x20);
      if (sVar1 == (this->map_->elements_).num_elements_) goto LAB_001be64e;
      local_28 = ParseContext::ParseMessage(ctx,(MessageLite *)(pvVar3 + 0x20),local_28 + 1);
      if (local_28 == (char *)0x0) {
        Map<std::__cxx11::string,CoreML::Specification::MILSpec::Block>::erase<std::__cxx11::string>
                  ((Map<std::__cxx11::string,CoreML::Specification::MILSpec::Block> *)this->map_,
                   value);
        return (char *)0x0;
      }
      bVar2 = ParseContext::Done(ctx,&local_28);
      if (bVar2) {
        return local_28;
      }
      if (local_28 == (char *)0x0) {
        return (char *)0x0;
      }
      NewEntry(this);
      other = this->value_ptr_;
      this_01 = mutable_value(this->entry_);
      CoreML::Specification::MILSpec::Block::Swap(this_01,other);
      Map<std::__cxx11::string,CoreML::Specification::MILSpec::Block>::erase<std::__cxx11::string>
                ((Map<std::__cxx11::string,CoreML::Specification::MILSpec::Block> *)this->map_,value
                );
    }
    this_00 = mutable_key(this->entry_);
    std::__cxx11::string::operator=((string *)this_00,(string *)value);
    goto LAB_001be66a;
  }
  NewEntry(this);
LAB_001be66a:
  local_28 = MapEntryImpl<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
             ::_InternalParse(this->entry_,local_28,ctx);
  if (local_28 == (char *)0x0) {
    return (char *)0x0;
  }
  UseKeyAndValueFromEntry(this);
  return local_28;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) {
      if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kKeyTag)) {
        ptr = KeyTypeHandler::Read(ptr + 1, ctx, &key_);
        if (PROTOBUF_PREDICT_FALSE(!ptr || !Derived::ValidateKey(&key_))) {
          return nullptr;
        }
        if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kValueTag)) {
          typename Map::size_type map_size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (PROTOBUF_PREDICT_TRUE(map_size != map_->size())) {
            using T =
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type;
            ptr = ValueTypeHandler::Read(ptr + 1, ctx,
                                         reinterpret_cast<T>(value_ptr_));
            if (PROTOBUF_PREDICT_FALSE(!ptr ||
                                       !Derived::ValidateValue(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return nullptr;
            }
            if (PROTOBUF_PREDICT_TRUE(ctx->Done(&ptr))) return ptr;
            if (!ptr) return nullptr;
            NewEntry();
            ValueMover::Move(value_ptr_, entry_->mutable_value());
            map_->erase(key_);
            goto move_key;
          }
        } else {
          if (!ptr) return nullptr;
        }
        NewEntry();
      move_key:
        KeyMover::Move(&key_, entry_->mutable_key());
      } else {
        if (!ptr) return nullptr;
        NewEntry();
      }
      ptr = entry_->_InternalParse(ptr, ctx);
      if (ptr) UseKeyAndValueFromEntry();
      return ptr;
    }